

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O1

void __thiscall
ScriptOperator_GetOperator_Test::~ScriptOperator_GetOperator_Test
          (ScriptOperator_GetOperator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ScriptOperator, GetOperator) {
  ScriptOperator ope;
  EXPECT_NO_THROW(ope = ScriptOperator::Get("OP_MIN"));
  EXPECT_STREQ(ope.ToCodeString().c_str(), "OP_MIN");
  EXPECT_NO_THROW(ope = ScriptOperator::Get("OP_3"));
  EXPECT_STREQ(ope.ToCodeString().c_str(), "OP_3");
  EXPECT_NO_THROW(ope = ScriptOperator::Get("OP_0"));
  EXPECT_STREQ(ope.ToCodeString().c_str(), "OP_0");
  EXPECT_NO_THROW(ope = ScriptOperator::Get("OP_1"));
  EXPECT_STREQ(ope.ToCodeString().c_str(), "OP_1");
  EXPECT_NO_THROW(ope = ScriptOperator::Get("OP_16"));
  EXPECT_STREQ(ope.ToCodeString().c_str(), "OP_16");
  EXPECT_NO_THROW(ope = ScriptOperator::Get("OP_TRUE"));
  EXPECT_STREQ(ope.ToCodeString().c_str(), "OP_TRUE");
  EXPECT_NO_THROW(ope = ScriptOperator::Get("OP_FALSE"));
  EXPECT_STREQ(ope.ToCodeString().c_str(), "OP_FALSE");
  EXPECT_NO_THROW(ope = ScriptOperator::Get("OP_1NEGATE"));
  EXPECT_STREQ(ope.ToCodeString().c_str(), "OP_1NEGATE");
  EXPECT_THROW((ope = ScriptOperator::Get("OP_xxxx")), CfdException);
}